

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTraceArguments.cpp
# Opt level: O0

JavascriptString *
Js::StackTraceArguments::TypeCodeToTypeName(uint typeCode,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptLibrary *pJVar4;
  ScriptContext *scriptContext_local;
  JavascriptString *pJStack_10;
  uint typeCode_local;
  
  switch(typeCode) {
  case 0:
    pJVar4 = ScriptContext::GetLibrary(scriptContext);
    pJStack_10 = JavascriptLibrary::GetNullDisplayString(pJVar4);
    break;
  case 1:
    pJVar4 = ScriptContext::GetLibrary(scriptContext);
    pJStack_10 = JavascriptLibrary::GetUndefinedDisplayString(pJVar4);
    break;
  case 2:
    pJVar4 = ScriptContext::GetLibrary(scriptContext);
    pJStack_10 = JavascriptLibrary::GetBooleanTypeDisplayString(pJVar4);
    break;
  case 3:
    pJVar4 = ScriptContext::GetLibrary(scriptContext);
    pJStack_10 = JavascriptLibrary::GetStringTypeDisplayString(pJVar4);
    break;
  case 4:
    pJVar4 = ScriptContext::GetLibrary(scriptContext);
    pJStack_10 = JavascriptLibrary::GetNaNDisplayString(pJVar4);
    break;
  case 5:
    pJVar4 = ScriptContext::GetLibrary(scriptContext);
    pJStack_10 = JavascriptLibrary::GetNumberTypeDisplayString(pJVar4);
    break;
  case 6:
    pJVar4 = ScriptContext::GetLibrary(scriptContext);
    pJStack_10 = JavascriptLibrary::GetSymbolTypeDisplayString(pJVar4);
    break;
  case 7:
    pJVar4 = ScriptContext::GetLibrary(scriptContext);
    pJStack_10 = JavascriptLibrary::GetObjectTypeDisplayString(pJVar4);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/StackTraceArguments.cpp"
                                ,0x3d,"(0)","Unknown type code");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
    pJVar4 = ScriptContext::GetLibrary(scriptContext);
    pJStack_10 = JavascriptLibrary::GetEmptyString(pJVar4);
  }
  return pJStack_10;
}

Assistant:

JavascriptString *StackTraceArguments::TypeCodeToTypeName(unsigned typeCode, ScriptContext *scriptContext)
    {
        switch(typeCode)
        {
            case nullValue:
                return scriptContext->GetLibrary()->GetNullDisplayString();
            case undefinedValue:
                return scriptContext->GetLibrary()->GetUndefinedDisplayString();
            case booleanValue:
                return scriptContext->GetLibrary()->GetBooleanTypeDisplayString();
            case stringValue:
                return scriptContext->GetLibrary()->GetStringTypeDisplayString();
            case nanValue:
                return scriptContext->GetLibrary()->GetNaNDisplayString();
            case numberValue:
                return scriptContext->GetLibrary()->GetNumberTypeDisplayString();
            case symbolValue:
                return scriptContext->GetLibrary()->GetSymbolTypeDisplayString();
            case objectValue:
                return scriptContext->GetLibrary()->GetObjectTypeDisplayString();
            default:
              AssertMsg(0, "Unknown type code");
              return scriptContext->GetLibrary()->GetEmptyString();
        }
    }